

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O1

GLuint piksel::compile(GLenum shaderType,string *shaderSource)

{
  long lVar1;
  GLuint GVar2;
  undefined8 uStack_50;
  GLchar aGStack_48 [8];
  pointer local_40;
  GLchar *c_str;
  GLint compileStatus;
  GLint infoLogLength;
  
  uStack_50 = 0x14ebe2;
  GVar2 = (*glad_glCreateShader)(shaderType);
  local_40 = (shaderSource->_M_dataplus)._M_p;
  uStack_50 = 0x14ec04;
  (*glad_glShaderSource)(GVar2,1,&local_40,(GLint *)0x0);
  uStack_50 = 0x14ec10;
  (*glad_glCompileShader)(GVar2);
  uStack_50 = 0x14ec2a;
  (*glad_glGetShaderiv)(GVar2,0x8b81,(GLint *)&c_str);
  if ((int)c_str == 0) {
    uStack_50 = 0x14ec57;
    (*glad_glGetShaderiv)(GVar2,0x8b84,(GLint *)((long)&c_str + 4));
    lVar1 = -((ulong)c_str._4_4_ + 0xf & 0xfffffffffffffff0);
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x14ec83;
    (*glad_glGetShaderInfoLog)(GVar2,c_str._4_4_,(GLint *)((long)&c_str + 4),aGStack_48 + lVar1);
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x14ec8f;
    (*glad_glDeleteShader)(GVar2);
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x14ecaa;
    fprintf(_stderr,"Shader compilation failed: %s\n",aGStack_48 + lVar1);
    GVar2 = 0;
  }
  return GVar2;
}

Assistant:

GLuint compile(GLenum shaderType, const std::string &shaderSource) {
    GLuint shader = glCreateShader(shaderType);
    const GLchar* c_str = shaderSource.c_str();
    glShaderSource(shader, 1, &c_str, NULL);
    glCompileShader(shader);

    GLint compileStatus;
    glGetShaderiv(shader, GL_COMPILE_STATUS, &compileStatus);
    if (compileStatus == GL_FALSE) {
        GLint infoLogLength;
        glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &infoLogLength);

        GLchar infoLog[infoLogLength];
        glGetShaderInfoLog(shader, infoLogLength, &infoLogLength, infoLog);
        
        glDeleteShader(shader);

        fprintf(stderr, "Shader compilation failed: %s\n", infoLog);

        return 0;
    }

    return shader;
}